

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void chapter3::user_query
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *word_count)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  pointer ppVar4;
  ostream *poVar5;
  _Self local_58;
  _Base_ptr local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_48;
  const_iterator itr;
  string local_30 [8];
  string search_word;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *word_count_local;
  
  std::__cxx11::string::string(local_30);
  std::operator<<((ostream *)&std::cout,"Please enter a word to search (q to quit): ");
  std::operator>>((istream *)&std::cin,local_30);
  while( true ) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"q");
    bVar2 = false;
    if (bVar1) {
      lVar3 = std::__cxx11::string::size();
      bVar2 = lVar3 != 0;
    }
    if (!bVar2) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Rb_tree_const_iterator(&local_48);
    local_50 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(word_count,(key_type *)local_30);
    local_48._M_node = local_50;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(word_count);
    bVar2 = std::operator!=(&local_48,&local_58);
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Found ");
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_48);
      poVar5 = std::operator<<(poVar5,(string *)ppVar4);
      poVar5 = std::operator<<(poVar5," ");
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_48);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,ppVar4->second);
      poVar5 = std::operator<<(poVar5," times");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Not found!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)&std::cout,"Another search (q to quit): ");
    std::operator>>((istream *)&std::cin,local_30);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

inline void chapter3::user_query(const map<string, int> &word_count) {
    string search_word;
    cout << "Please enter a word to search (q to quit): ";
    cin >> search_word;

    while (search_word != "q" && search_word.size()) {
        map<string, int>::const_iterator itr;
        if ((itr = word_count.find(search_word)) != word_count.end()) {
            cout << "Found "
                 << itr->first
                 << " "
                 << itr-> second
                 << " times" << endl;
        } else {
            cout << "Not found!" << endl;
        }

        cout << "Another search (q to quit): ";
        cin >> search_word;
    }
}